

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf-sequencing-algorithm.cpp
# Opt level: O0

set<int,_std::less<int>,_std::allocator<int>_> * get_angles(string *file,int n)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  string *in_RSI;
  set<int,_std::less<int>,_std::allocator<int>_> *in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar4;
  size_t previous;
  size_t current;
  char delim;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  q;
  string line;
  ifstream _file;
  set<int,_std::less<int>,_std::allocator<int>_> *angles;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffffc88;
  string *this;
  string local_318 [36];
  int local_2f4;
  _Base_ptr local_2f0;
  undefined1 local_2e8;
  string local_2e0 [36];
  int local_2bc;
  long local_2b8;
  long local_2b0;
  char local_2a1;
  byte local_24d;
  string local_240 [32];
  long local_220 [68];
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,pcVar2,_S_in);
  std::__cxx11::string::string(local_240);
  bVar1 = std::ios::operator!((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"ERROR: unable to open instance file: ");
    poVar3 = std::operator<<(poVar3,in_RSI);
    std::operator<<(poVar3,", stopping! \n");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"##Reading volume files.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_220,local_240);
  std::ifstream::close();
  local_24d = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x10748b);
  std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            ((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
  local_2a1 = ' ';
  local_2b8 = 0;
  this = local_240;
  local_2b0 = std::__cxx11::string::find((char)this,0x20);
  poVar3 = std::operator<<((ostream *)&std::cout,this);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  while (local_2b0 != -1) {
    std::__cxx11::string::substr((ulong)local_2e0,(ulong)local_240);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    local_2bc = atoi(pcVar2);
    pVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)this,
                       (value_type_conflict2 *)in_stack_fffffffffffffc88._M_node);
    in_stack_fffffffffffffc88 = pVar4.first._M_node;
    local_2e8 = pVar4.second;
    local_2f0 = in_stack_fffffffffffffc88._M_node;
    std::__cxx11::string::~string(local_2e0);
    local_2b8 = local_2b0 + 1;
    local_2b0 = std::__cxx11::string::find((char)local_240,(ulong)(uint)(int)local_2a1);
  }
  std::__cxx11::string::substr((ulong)local_318,(ulong)local_240);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_2f4 = atoi(pcVar2);
  std::set<int,_std::less<int>,_std::allocator<int>_>::insert
            ((set<int,_std::less<int>,_std::allocator<int>_> *)this,
             (value_type_conflict2 *)in_stack_fffffffffffffc88._M_node);
  std::__cxx11::string::~string(local_318);
  local_24d = 1;
  std::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~stack((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x1076c7);
  if ((local_24d & 1) == 0) {
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x10770d);
  }
  std::__cxx11::string::~string(local_240);
  std::ifstream::~ifstream(local_220);
  return in_RDI;
}

Assistant:

set<int> get_angles(string file, int n){
  ifstream _file(file.c_str(), ios::in);
  string line;

  if (! _file)
    cerr << "ERROR: unable to open instance file: " << file << ", stopping! \n";

  cout << "##Reading volume files." << endl;
  getline(_file, line);
  _file.close();

  set<int> angles;
  stack<string> q;
  char delim=' ';
  std::size_t current, previous = 0;
  current = line.find(delim);
  cout << line << endl;
  while (current != std::string::npos) {
    angles.insert(atoi(line.substr(previous, current - previous).c_str()));
    previous = current + 1;
    current = line.find(delim, previous);
  }
  angles.insert(atoi(line.substr(previous, current - previous).c_str()));

  return angles;
}